

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool __thiscall ImGuiTextFilter::PassFilter(ImGuiTextFilter *this,char *text,char *text_end)

{
  char cVar1;
  int iVar2;
  ImGuiTextRange *pIVar3;
  char *pcVar4;
  int i;
  int i_00;
  char *haystack;
  bool bVar5;
  
  iVar2 = (this->Filters).Size;
  if (iVar2 == 0) {
    bVar5 = true;
  }
  else {
    haystack = "";
    if (text != (char *)0x0) {
      haystack = text;
    }
    for (i_00 = 0; i_00 != iVar2; i_00 = i_00 + 1) {
      pIVar3 = ImVector<ImGuiTextFilter::ImGuiTextRange>::operator[](&this->Filters,i_00);
      pcVar4 = pIVar3->b;
      if (pcVar4 != pIVar3->e) {
        cVar1 = *pcVar4;
        if (cVar1 == '-') {
          pcVar4 = pcVar4 + 1;
        }
        pcVar4 = ImStristr(haystack,text_end,pcVar4,pIVar3->e);
        if (pcVar4 != (char *)0x0) {
          return cVar1 != '-';
        }
      }
      iVar2 = (this->Filters).Size;
    }
    bVar5 = this->CountGrep == 0;
  }
  return bVar5;
}

Assistant:

int ImTextStrFromUtf8(ImWchar* buf, int buf_size, const char* in_text, const char* in_text_end, const char** in_text_remaining)
{
    ImWchar* buf_out = buf;
    ImWchar* buf_end = buf + buf_size;
    while (buf_out < buf_end - 1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c;
        in_text += ImTextCharFromUtf8(&c, in_text, in_text_end);
        if (c == 0)
            break;
        *buf_out++ = (ImWchar)c;
    }
    *buf_out = 0;
    if (in_text_remaining)
        *in_text_remaining = in_text;
    return (int)(buf_out - buf);
}